

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O3

SubControl __thiscall QScrollBarPrivate::newHoverControl(QScrollBarPrivate *this,QPoint *pos)

{
  QWidget *this_00;
  SubControl SVar1;
  QStyle *pQVar2;
  long lVar3;
  undefined8 *puVar4;
  QStyleOptionSlider *pQVar5;
  long in_FS_OFFSET;
  QRect QVar6;
  QStyleOptionSlider opt;
  QStyleOptionSlider QStack_a8;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x8;
  puVar4 = &DAT_006dcab0;
  pQVar5 = &QStack_a8;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)pQVar5 = *puVar4;
    puVar4 = puVar4 + 1;
    pQVar5 = (QStyleOptionSlider *)((long)pQVar5 + 8);
  }
  QStyleOptionSlider::QStyleOptionSlider(&QStack_a8);
  (**(code **)(*(long *)this_00 + 0x1a8))(this_00,&QStack_a8);
  QStack_a8.super_QStyleOptionComplex.subControls.super_QFlagsStorageHelper<QStyle::SubControl,_4>.
  super_QFlagsStorage<QStyle::SubControl>.i =
       (QFlagsStorageHelper<QStyle::SubControl,_4>)(QFlagsStorage<QStyle::SubControl>)0xffffffff;
  pQVar2 = QWidget::style(this_00);
  SVar1 = (**(code **)(*(long *)pQVar2 + 0xd0))(pQVar2,2,&QStack_a8,pos,this_00);
  this->hoverControl = SVar1;
  if (SVar1 == SC_None) {
    (this->hoverRect).x1 = 0;
    (this->hoverRect).y1 = 0;
    (this->hoverRect).x2 = -1;
    (this->hoverRect).y2 = -1;
    SVar1 = SC_None;
  }
  else {
    pQVar2 = QWidget::style(this_00);
    QVar6 = (QRect)(**(code **)(*(long *)pQVar2 + 0xd8))
                             (pQVar2,2,&QStack_a8,this->hoverControl,this_00);
    this->hoverRect = QVar6;
    SVar1 = this->hoverControl;
  }
  QStyleOption::~QStyleOption((QStyleOption *)&QStack_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return SVar1;
  }
  __stack_chk_fail();
}

Assistant:

QStyle::SubControl QScrollBarPrivate::newHoverControl(const QPoint &pos)
{
    Q_Q(QScrollBar);
    QStyleOptionSlider opt;
    q->initStyleOption(&opt);
    opt.subControls = QStyle::SC_All;
    hoverControl = q->style()->hitTestComplexControl(QStyle::CC_ScrollBar, &opt, pos, q);
    if (hoverControl == QStyle::SC_None)
        hoverRect = QRect();
    else
        hoverRect = q->style()->subControlRect(QStyle::CC_ScrollBar, &opt, hoverControl, q);
    return hoverControl;
}